

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::generateClustersInitialGuess
               (TParameters *params,TSimilarityMap *ccMap,TClusters *clusters)

{
  double dVar1;
  pointer piVar2;
  key_type *pkVar3;
  int iVar4;
  ulong uVar5;
  pointer __dest;
  mapped_type *pmVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  pointer pPVar10;
  key_type *pkVar11;
  pointer __p;
  int iVar12;
  long lVar13;
  long lVar14;
  pointer pPVar15;
  size_t __n_00;
  pointer pPVar16;
  int iVar17;
  int *cid;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  reference rVar21;
  allocator_type local_f1;
  TClusters *__range2;
  int local_e4;
  ulong local_e0;
  vector<Pair,_std::allocator<Pair>_> local_d8;
  TParameters *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  size_type local_98;
  ulong local_90;
  ulong local_88;
  TSimilarityMap *local_80;
  long local_78;
  double local_70;
  long local_68;
  vector<bool,_std::allocator<bool>_> used;
  
  uVar5 = ((long)(ccMap->
                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(ccMap->
                super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar17 = (int)uVar5;
  local_b8 = params;
  std::vector<int,_std::allocator<int>_>::resize(clusters,(long)iVar17);
  piVar2 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar9 = 0;
  local_a8 = 0;
  if (0 < iVar17) {
    local_a8 = uVar5 & 0xffffffff;
  }
  for (; local_a8 != uVar9; uVar9 = uVar9 + 1) {
    piVar2[uVar9] = (int)uVar9;
  }
  local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_e4 = 1;
  iVar12 = local_e4;
  if (1 < iVar17) {
    iVar12 = iVar17;
  }
  local_90 = (ulong)(iVar12 - 1);
  local_b0 = 0x10;
  pPVar10 = (pointer)0x0;
  pPVar16 = (pointer)0x0;
  uVar9 = 0;
  __range2 = clusters;
  local_e0 = uVar5;
  local_98 = (long)iVar17;
  local_80 = ccMap;
  while (pPVar15 = local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                   super__Vector_impl_data._M_start, uVar9 != local_90) {
    local_88 = uVar9 + 1;
    lVar13 = uVar9 * 0x18;
    lVar14 = local_b0;
    iVar17 = local_e4;
    local_a0 = uVar9;
    local_78 = lVar13;
    while( true ) {
      iVar12 = (int)uVar9;
      __n = 0x7ffffffffffffff;
      if ((int)local_e0 <= iVar17) break;
      dVar1 = *(double *)
               (*(long *)((long)&(((ccMap->
                                   super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                 super__Vector_impl_data + lVar13) + lVar14);
      uVar19 = SUB84(dVar1,0);
      uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
      if (pPVar16 == pPVar10) {
        __n_00 = (long)pPVar10 - (long)pPVar15;
        if (__n_00 == 0x7ffffffffffffff0) {
          local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
          _M_start = pPVar15;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n_00 >> 4);
        pPVar16 = (pointer)0x1;
        if (pPVar10 != pPVar15) {
          pPVar16 = __p;
        }
        uVar5 = (long)&__p->i + (long)&pPVar16->i;
        if (0x7fffffffffffffe < uVar5) {
          uVar5 = 0x7ffffffffffffff;
        }
        if (CARRY8((ulong)pPVar16,(ulong)__p)) {
          uVar5 = 0x7ffffffffffffff;
        }
        local_68 = lVar14;
        if (uVar5 == 0) {
          __dest = (pointer)0x0;
        }
        else {
          local_70 = dVar1;
          __dest = (pointer)operator_new(uVar5 << 4);
          iVar12 = (int)local_a0;
          uVar19 = SUB84(local_70,0);
          uVar20 = (undefined4)((ulong)local_70 >> 0x20);
          __n = extraout_RDX;
        }
        __dest[(long)__p].i = iVar12;
        __dest[(long)__p].j = iVar17;
        __dest[(long)__p].cc = (double)CONCAT44(uVar20,uVar19);
        if (0 < (long)__n_00) {
          memmove(__dest,pPVar15,__n_00);
          __n = extraout_RDX_00;
        }
        pPVar16 = (pointer)(__n_00 + (long)__dest);
        std::_Vector_base<Pair,_std::allocator<Pair>_>::_M_deallocate
                  ((_Vector_base<Pair,_std::allocator<Pair>_> *)pPVar15,__p,__n);
        pPVar10 = __dest + uVar5;
        ccMap = local_80;
        uVar9 = local_a0;
        lVar13 = local_78;
        lVar14 = local_68;
        local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pPVar10;
      }
      else {
        pPVar16->i = iVar12;
        pPVar16->j = iVar17;
        pPVar16->cc = dVar1;
        __dest = pPVar15;
      }
      pPVar16 = pPVar16 + 1;
      lVar14 = lVar14 + 0x10;
      iVar17 = iVar17 + 1;
      pPVar15 = __dest;
      local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
      _M_finish = pPVar16;
    }
    local_b0 = local_b0 + 0x10;
    local_e4 = local_e4 + 1;
    uVar9 = local_88;
    local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
    _M_start = pPVar15;
  }
  if (local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
      _M_start != pPVar16) {
    lVar14 = (long)pPVar16 -
             (long)local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar5 = lVar14 >> 4;
    lVar13 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
               super__Vector_impl_data._M_start,pPVar16,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar14 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar15,pPVar16);
    }
    else {
      pPVar10 = pPVar15 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar15,pPVar10);
      for (; pPVar10 != pPVar16; pPVar10 = pPVar10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pPVar10);
      }
    }
  }
  std::vector<bool,_std::allocator<bool>_>::vector(&used,local_98,&local_f1);
  uVar9 = (ulong)((long)pPVar16 - (long)pPVar15) >> 4;
  uVar18 = 0;
  uVar5 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar5 = uVar18;
  }
  for (; uVar18 != uVar5; uVar18 = uVar18 + 1) {
    piVar2 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = piVar2[pPVar15[uVar18].i];
    iVar12 = piVar2[pPVar15[uVar18].j];
    if (((iVar17 != iVar12) &&
        (rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,(long)iVar17),
        (*rVar21._M_p & rVar21._M_mask) == 0)) &&
       (rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,(long)iVar12),
       (*rVar21._M_p & rVar21._M_mask) == 0)) {
      iVar4 = iVar12;
      if (iVar12 < iVar17) {
        iVar4 = iVar17;
      }
      if (iVar17 < iVar12) {
        iVar12 = iVar17;
      }
      piVar2 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = 0; local_a8 != uVar9; uVar9 = uVar9 + 1) {
        if (piVar2[uVar9] == iVar4) {
          piVar2[uVar9] = iVar12;
        }
      }
      rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,(long)iVar4);
      *rVar21._M_p = *rVar21._M_p | rVar21._M_mask;
      uVar8 = (int)local_e0 - 1;
      local_e0 = (ulong)uVar8;
      if ((int)uVar8 <= local_b8->maxClusters) break;
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&used);
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  pkVar3 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar17 = 0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)
         used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
         super__Bit_iterator_base._8_8_;
  for (pkVar11 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; pkVar11 != pkVar3; pkVar11 = pkVar11 + 1) {
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&used,pkVar11);
    if (*pmVar6 < 1) {
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&used,pkVar11);
      iVar17 = iVar17 + 1;
      *pmVar6 = iVar17;
    }
  }
  pkVar3 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pkVar11 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; pkVar11 != pkVar3; pkVar11 = pkVar11 + 1) {
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&used,pkVar11);
    *pkVar11 = *pmVar6 + -1;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&used);
  piVar7 = (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  do {
    if (piVar7 == (__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<Pair,_std::allocator<Pair>_>::~vector(&local_d8);
      return true;
    }
    iVar17 = *piVar7;
  } while ((-1 < iVar17) && (piVar7 = piVar7 + 1, iVar17 < local_b8->maxClusters));
  __assert_fail("cid >= 0 && cid < params.maxClusters",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x3a4,
                "bool Cipher::generateClustersInitialGuess(const TParameters &, const TSimilarityMap &, TClusters &)"
               );
}

Assistant:

bool generateClustersInitialGuess(
            const TParameters & params,
            const TSimilarityMap & ccMap,
            TClusters & clusters) {
        int n = ccMap.size();

        int nClusters = n;
        clusters.resize(n);
        for (int i = 0; i < n; ++i) {
            clusters[i] = i;
        }

        struct Pair {
            int i;
            int j;
            double cc;

            bool operator < (const Pair & a) const { return cc > a.cc; }
        };

        std::vector<Pair> ccPairs;
        for (int i = 0; i < n - 1; ++i) {
            for (int j = i + 1; j < n; ++j) {
                ccPairs.emplace_back(Pair{i, j, ccMap[i][j].cc});
            }
        }

        std::sort(ccPairs.begin(), ccPairs.end());

        {
            std::vector<bool> used(n);

            for (int k = 0; k < (int) ccPairs.size(); ++k) {
                int i = ccPairs[k].i;
                int j = ccPairs[k].j;

                if (clusters[i] == clusters[j]) continue;

                int cidi = clusters[i];
                int cidj = clusters[j];

                if (used[cidi] || used[cidj]) continue;

                if (cidi > cidj) {
                    std::swap(cidi, cidj);
                }

                for (int p = 0; p < n; ++p) {
                    if (clusters[p] == cidj) {
                        clusters[p] = cidi;
                    }
                }
                used[cidj] = true;
                --nClusters;

                if (nClusters <= params.maxClusters) break;
            }
        }

        {
            int cnt = 0;
            std::map<int, int> used;
            for (auto & cid : clusters) {
                if (used[cid] > 0) continue;
                used[cid] = ++cnt;
            }

            for (auto & cid : clusters) {
                cid = used[cid] - 1;
            }
        }

        //printf("nClusters = %d\n", nClusters);
        for (auto & cid : clusters) {
            assert(cid >= 0 && cid < params.maxClusters);
        }

        return true;
    }